

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlElemDesc * htmlTagLookup(xmlChar *tag)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x40 == 0x1740) {
      return (htmlElemDesc *)0x0;
    }
    iVar2 = xmlStrcasecmp(tag,*(xmlChar **)((long)&html40ElementTable[0].name + lVar3));
    lVar1 = lVar3 + 0x40;
  } while (iVar2 != 0);
  return (htmlElemDesc *)((long)&html40ElementTable[0].name + lVar3);
}

Assistant:

const htmlElemDesc *
htmlTagLookup(const xmlChar *tag) {
    unsigned int i;

    for (i = 0; i < (sizeof(html40ElementTable) /
                     sizeof(html40ElementTable[0]));i++) {
        if (!xmlStrcasecmp(tag, BAD_CAST html40ElementTable[i].name))
	    return((htmlElemDescPtr) &html40ElementTable[i]);
    }
    return(NULL);
}